

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_frameProgression *
ZSTD_getFrameProgression(ZSTD_frameProgression *__return_storage_ptr__,ZSTD_CCtx *cctx)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  
  if (0 < (cctx->appliedParams).nbWorkers) {
    ZSTDMT_getFrameProgression(__return_storage_ptr__,cctx->mtctx);
    return __return_storage_ptr__;
  }
  if (cctx->inBuff != (char *)0x0) {
    uVar2 = cctx->inBuffPos - cctx->inToCompress;
    if (uVar2 != 0) {
      if (cctx->inBuffPos < cctx->inToCompress) {
        __assert_fail("cctx->inBuffPos >= cctx->inToCompress",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2f0f,"ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx *)");
      }
      if (0x20000 < uVar2) {
        __assert_fail("buffered <= ZSTD_BLOCKSIZE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2f10,"ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx *)");
      }
      goto LAB_0010c74b;
    }
  }
  uVar2 = 0;
LAB_0010c74b:
  uVar1 = cctx->consumedSrcSize;
  __return_storage_ptr__->ingested = uVar2 + uVar1;
  __return_storage_ptr__->consumed = uVar1;
  uVar1 = cctx->producedCSize;
  __return_storage_ptr__->produced = uVar1;
  __return_storage_ptr__->flushed = uVar1;
  __return_storage_ptr__->currentJobID = 0;
  __return_storage_ptr__->nbActiveWorkers = 0;
  return __return_storage_ptr__;
}

Assistant:

ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx* cctx)
{
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        return ZSTDMT_getFrameProgression(cctx->mtctx);
    }
#endif
    {   ZSTD_frameProgression fp;
        size_t const buffered = (cctx->inBuff == NULL) ? 0 :
                                cctx->inBuffPos - cctx->inToCompress;
        if (buffered) assert(cctx->inBuffPos >= cctx->inToCompress);
        assert(buffered <= ZSTD_BLOCKSIZE_MAX);
        fp.ingested = cctx->consumedSrcSize + buffered;
        fp.consumed = cctx->consumedSrcSize;
        fp.produced = cctx->producedCSize;
        fp.flushed  = cctx->producedCSize;   /* simplified; some data might still be left within streaming output buffer */
        fp.currentJobID = 0;
        fp.nbActiveWorkers = 0;
        return fp;
}   }